

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# superblock.cc
# Opt level: O2

void sb_bmp_set(uint8_t *bmp,bid_t bid,uint64_t len)

{
  _sb_bmp_update(bmp,bid,len,1);
  return;
}

Assistant:

void sb_bmp_set(uint8_t *bmp, bid_t bid, uint64_t len)
{
    _sb_bmp_update(bmp, bid, len, 1);
}